

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::warning<>(ValidationContext *this,IssueWarning *issue)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  allocator<char> local_71;
  undefined1 local_70 [40];
  string local_48;
  undefined1 local_28 [16];
  
  this->numWarning = this->numWarning + 1;
  if (this->treatWarningsAsError == true) {
    this->returnCode = 3;
    local_70[0] = error;
    local_70._2_2_ = (issue->super_Issue).id;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)(local_70 + 8),&(issue->super_Issue).message,&local_71);
    fmt.size_ = 0;
    fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_28;
    ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args)
    ;
    std::function<void_(const_ktx::ValidationReport_&)>::operator()
              (&this->callback,(ValidationReport *)local_70);
  }
  else {
    local_70[0] = (issue->super_Issue).type;
    local_70._2_2_ = (issue->super_Issue).id;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)(local_70 + 8),&(issue->super_Issue).message,&local_71);
    fmt_00.size_ = 0;
    fmt_00.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_28;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_48,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt_00,args_00);
    std::function<void_(const_ktx::ValidationReport_&)>::operator()
              (&this->callback,(ValidationReport *)local_70);
  }
  ValidationReport::~ValidationReport((ValidationReport *)local_70);
  return;
}

Assistant:

void warning(const IssueWarning& issue, Args&&... args) {
        ++numWarning;
        if (treatWarningsAsError) {
            returnCode = +rc::INVALID_FILE;
            callback(ValidationReport{IssueType::error, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});

        } else {
            callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
        }
    }